

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall duckdb::CSVErrorHandler::ThrowError(CSVErrorHandler *this,CSVError *csv_error)

{
  CSVErrorType CVar1;
  CSVError *pCVar2;
  CSVError *pCVar3;
  bool bVar4;
  ulong uVar5;
  idx_t iVar6;
  ostream *poVar7;
  ConversionException *this_00;
  LinesPerBoundary *error_info;
  string local_260;
  CSVError *local_240;
  CSVError error_to_throw;
  ostringstream error;
  
  CSVError::CSVError(&error_to_throw,csv_error);
  uVar5 = GetLineInternal(this,&error_to_throw.error_info);
  if (((this->print_line == true) && (error_to_throw.type < 9)) &&
     ((0x1ddU >> (error_to_throw.type & 0x1f) & 1) != 0)) {
    pCVar2 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
             super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar3 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
             super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar2 != pCVar3) {
      local_240 = csv_error;
      for (error_info = &pCVar2->error_info; csv_error = local_240,
          (CSVError *)(error_info + -7) != pCVar3; error_info = error_info + 9) {
        bVar4 = CanGetLine(this,error_info->boundary_idx);
        if ((bVar4) && (iVar6 = GetLineInternal(this,error_info), iVar6 < uVar5)) {
          CSVError::operator=(&error_to_throw,(CSVError *)(error_info + -7));
          uVar5 = iVar6;
        }
      }
    }
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  if (((this->print_line == true) && (error_to_throw.type < 9)) &&
     ((0x1ddU >> (error_to_throw.type & 0x1f) & 1) != 0)) {
    poVar7 = ::std::operator<<((ostream *)&error,"CSV Error on Line: ");
    poVar7 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    ::std::operator<<(poVar7,'\n');
    if (error_to_throw.csv_row._M_string_length != 0) {
      poVar7 = ::std::operator<<((ostream *)&error,"Original Line: ");
      poVar7 = ::std::operator<<(poVar7,(string *)&error_to_throw.csv_row);
      ::std::operator<<(poVar7,'\n');
    }
  }
  ::std::operator<<((ostream *)&error,
                    (string *)
                    (&error_to_throw.error_message +
                    (error_to_throw.full_error_message._M_string_length != 0)));
  CVar1 = csv_error->type;
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  if (CVar1 == NULLPADDED_QUOTED_NEW_VALUE) {
    ::std::__cxx11::stringbuf::str();
    ParameterNotAllowedException::ParameterNotAllowedException
              ((ParameterNotAllowedException *)this_00,&local_260);
    __cxa_throw(this_00,&ParameterNotAllowedException::typeinfo,::std::runtime_error::~runtime_error
               );
  }
  if (CVar1 == COLUMN_NAME_TYPE_MISMATCH) {
    ::std::__cxx11::stringbuf::str();
    BinderException::BinderException((BinderException *)this_00,&local_260);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (CVar1 != CAST_ERROR) {
    ::std::__cxx11::stringbuf::str();
    InvalidInputException::InvalidInputException((InvalidInputException *)this_00,&local_260);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::stringbuf::str();
  ConversionException::ConversionException(this_00,&local_260);
  __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVErrorHandler::ThrowError(const CSVError &csv_error) {
	auto error_to_throw = csv_error;
	idx_t error_to_throw_row = GetLineInternal(error_to_throw.error_info);
	if (PrintLineNumber(error_to_throw) && !errors.empty()) {
		// We stored a previous error here, we pick the one that happens the earliest to throw
		for (const auto &error : errors) {
			if (CanGetLine(error.GetBoundaryIndex())) {
				idx_t cur_error_to_throw = GetLineInternal(error.error_info);
				if (cur_error_to_throw < error_to_throw_row) {
					error_to_throw = error;
					error_to_throw_row = cur_error_to_throw;
				}
			}
		}
	}
	std::ostringstream error;
	if (PrintLineNumber(error_to_throw)) {
		error << "CSV Error on Line: " << error_to_throw_row << '\n';
		if (!error_to_throw.csv_row.empty()) {
			error << "Original Line: " << error_to_throw.csv_row << '\n';
		}
	}
	if (error_to_throw.full_error_message.empty()) {
		error << error_to_throw.error_message;
	} else {
		error << error_to_throw.full_error_message;
	}
	switch (csv_error.type) {
	case CAST_ERROR:
		throw ConversionException(error.str());
	case COLUMN_NAME_TYPE_MISMATCH:
		throw BinderException(error.str());
	case NULLPADDED_QUOTED_NEW_VALUE:
		throw ParameterNotAllowedException(error.str());
	default:
		throw InvalidInputException(error.str());
	}
}